

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolortransform.cpp
# Opt level: O0

void __thiscall
QColorTransformPrivate::applyConvertIn<unsigned_char>
          (QColorTransformPrivate *this,uchar *src,QColorVector *buffer,qsizetype len,
          TransformFlags flags)

{
  bool bVar1;
  Int IVar2;
  QColorSpacePrivate *pQVar3;
  const_iterator o;
  QColorTransformPrivate *in_RCX;
  QColorVector *in_RDX;
  QColorVector *in_RSI;
  quint8 *in_RDI;
  long in_FS_OFFSET;
  variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT> *element;
  QList<std::variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>_>
  *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
  *in_stack_ffffffffffffff78;
  QColorMatrix *in_stack_ffffffffffffff80;
  QColorMatrix *in_stack_ffffffffffffff98;
  QColorVector *in_stack_ffffffffffffffb8;
  const_iterator local_28;
  QFlagsStorageHelper<QColorTransformPrivate::TransformFlag,_4> local_1c;
  QColorVector *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = in_RDX;
  pQVar3 = QExplicitlySharedDataPointer<const_QColorSpacePrivate>::operator->
                     ((QExplicitlySharedDataPointer<const_QColorSpacePrivate> *)0x4d3df8);
  bVar1 = QColorSpacePrivate::isThreeComponentMatrix(pQVar3);
  if (bVar1) {
    loadGray(in_stack_ffffffffffffffb8,in_RDI,(qsizetype)in_RSI,in_RCX);
    pQVar3 = QExplicitlySharedDataPointer<const_QColorSpacePrivate>::operator->
                       ((QExplicitlySharedDataPointer<const_QColorSpacePrivate> *)0x4d3e30);
    bVar1 = QColorSpacePrivate::isThreeComponentMatrix(pQVar3);
    if ((!bVar1) ||
       (pQVar3 = QExplicitlySharedDataPointer<const_QColorSpacePrivate>::operator->
                           ((QExplicitlySharedDataPointer<const_QColorSpacePrivate> *)0x4d3e4c),
       pQVar3->colorModel != Gray)) {
      QExplicitlySharedDataPointer<const_QColorSpacePrivate>::operator->
                ((QExplicitlySharedDataPointer<const_QColorSpacePrivate> *)0x4d3e60);
      bVar1 = QColorMatrix::isNull(in_stack_ffffffffffffff80);
      if (!bVar1) {
        QExplicitlySharedDataPointer<const_QColorSpacePrivate>::operator->
                  ((QExplicitlySharedDataPointer<const_QColorSpacePrivate> *)0x4d3e94);
        applyMatrix<(ApplyMatrixForm)1>(in_RSI,(qsizetype)in_RCX,in_stack_ffffffffffffff98);
      }
    }
  }
  else {
    local_1c.super_QFlagsStorage<QColorTransformPrivate::TransformFlag>.i =
         (QFlagsStorage<QColorTransformPrivate::TransformFlag>)
         QFlags<QColorTransformPrivate::TransformFlag>::operator&
                   ((QFlags<QColorTransformPrivate::TransformFlag> *)in_stack_ffffffffffffff80,
                    (TransformFlag)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
    if (IVar2 == 0) {
      loadUnpremultipliedLUT(local_18,(uchar *)in_RSI,(qsizetype)in_RCX);
    }
    else {
      loadPremultipliedLUT();
    }
    QExplicitlySharedDataPointer<const_QColorSpacePrivate>::operator->
              ((QExplicitlySharedDataPointer<const_QColorSpacePrivate> *)0x4d3f1c);
    local_28.i = (variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
                  *)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = QList<std::variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>_>
               ::begin((QList<std::variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>_>
                        *)in_stack_ffffffffffffff80);
    o = QList<std::variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>_>
        ::end((QList<std::variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>_>
               *)in_stack_ffffffffffffff80);
    while (bVar1 = QList<std::variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>_>
                   ::const_iterator::operator!=(&local_28,o), bVar1) {
      QList<std::variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>_>
      ::const_iterator::operator*(&local_28);
      std::
      visit<QColorTransformPrivate::applyConvertIn<unsigned_char>(unsigned_char_const*,QColorVector*,long_long,QFlags<QColorTransformPrivate::TransformFlag>)const::_lambda(auto:1&&)_1_,std::variant<QColorSpacePrivate::TransferElement,QColorMatrix,QColorVector,QColorCLUT>const&>
                ((anon_class_16_2_4b7f43a0 *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      QList<std::variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>_>
      ::const_iterator::operator++(&local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColorTransformPrivate::applyConvertIn(const S *src, QColorVector *buffer, qsizetype len, TransformFlags flags) const
{
    if constexpr (IsGrayscale<S>) {
        if (colorSpaceIn->isThreeComponentMatrix()) {
            loadGray(buffer, src, len, this);
            if (!colorSpaceOut->isThreeComponentMatrix() || colorSpaceIn->colorModel != QColorSpace::ColorModel::Gray) {
                if (!colorSpaceIn->chad.isNull())
                    applyMatrix<DoClamp>(buffer, len, colorSpaceIn->chad);
            }
            return;
        }
    } else if constexpr (CanUseThreeComponent<S>) {
        if (colorSpaceIn->isThreeComponentMatrix()) {
            if (flags & InputPremultiplied)
                loadPremultiplied(buffer, src, len, this);
            else
                loadUnpremultiplied(buffer, src, len, this);

            if (!colorSpaceOut->isThreeComponentMatrix())
                applyMatrix<DoClamp>(buffer, len, colorMatrix);
            return;
        }
    }
    Q_ASSERT(!colorSpaceIn->isThreeComponentMatrix());

    if (flags & InputPremultiplied)
        loadPremultipliedLUT(buffer, src, len);
    else
        loadUnpremultipliedLUT(buffer, src, len);

    // Do element based conversion
    for (auto &&element : colorSpaceIn->mAB)
        std::visit([&buffer, len](auto &&elm) { visitElement(elm, buffer, len); }, element);
}